

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

int __thiscall smf::MidiFile::getFileDurationInTicks(MidiFile *this)

{
  int iVar1;
  pointer ppMVar2;
  MidiEvent *pMVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = this->m_theTimeState;
  if (iVar1 == 0) {
    makeAbsoluteTicks(this);
  }
  ppMVar2 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->m_events).
                          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2) >> 3) < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      pMVar3 = MidiEventList::back(ppMVar2[lVar5]);
      if (iVar4 < pMVar3->tick) {
        pMVar3 = MidiEventList::back((this->m_events).
                                     super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar5]);
        iVar4 = pMVar3->tick;
      }
      lVar5 = lVar5 + 1;
      ppMVar2 = (this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar5 < (int)((ulong)((long)(this->m_events).
                                         super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2)
                          >> 3));
  }
  if (iVar1 == 0) {
    makeDeltaTicks(this);
  }
  return iVar4;
}

Assistant:

int MidiFile::getFileDurationInTicks(void) {
	bool revertToDelta = false;
	if (isDeltaTicks()) {
		makeAbsoluteTicks();
		revertToDelta = true;
	}
	const MidiFile& mf = *this;
	int output = 0;
	for (int i=0; i<mf.getTrackCount(); i++) {
		if (mf[i].back().tick > output) {
			output = mf[i].back().tick;
		}
	}
	if (revertToDelta) {
		deltaTicks();
	}
	return output;
}